

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall glslang::TSymbolTable::amendSymbolIdLevel(TSymbolTable *this,TSymbol *symbol)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  uVar1 = (int)((ulong)((long)(this->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->table).
                             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  uVar3 = 0x7f00000000000000;
  if (uVar1 < 0x80) {
    uVar3 = (ulong)uVar1 << 0x38;
  }
  iVar2 = (*symbol->_vptr_TSymbol[0xf])(symbol);
  (*symbol->_vptr_TSymbol[0xe])(symbol,CONCAT44(extraout_var,iVar2) & 0xffffffffffffff | uVar3);
  return;
}

Assistant:

void amendSymbolIdLevel(TSymbol& symbol)
    {
        // clamp level to avoid overflow
        uint64_t level = (uint32_t)currentLevel() > MaxLevelInUniqueID ? MaxLevelInUniqueID : currentLevel();
        uint64_t symbolId = symbol.getUniqueId();
        symbolId &= uniqueIdMask;
        symbolId |= (level << LevelFlagBitOffset);
        symbol.setUniqueId(symbolId);
    }